

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O2

Int64ToStringMap * __thiscall
CoreML::Specification::Int64ToStringMap::New(Int64ToStringMap *this,Arena *arena)

{
  Int64ToStringMap *this_00;
  
  this_00 = (Int64ToStringMap *)operator_new(0x38);
  Int64ToStringMap(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::Int64ToStringMap>(arena,this_00);
  }
  return this_00;
}

Assistant:

Int64ToStringMap* Int64ToStringMap::New(::google::protobuf::Arena* arena) const {
  Int64ToStringMap* n = new Int64ToStringMap;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}